

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

size_t mpack_node_array_length(mpack_node_t node)

{
  if ((node.tree)->error != mpack_ok) {
    return 0;
  }
  if ((node.data)->type == mpack_type_array) {
    return (ulong)(node.data)->len;
  }
  mpack_tree_flag_error(node.tree,mpack_error_type);
  return 0;
}

Assistant:

MPACK_INLINE size_t mpack_node_array_length(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type != mpack_type_array) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    return (size_t)node.data->len;
}